

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_access_chain(CompilerHLSL *this,Instruction *instruction)

{
  uint uVar1;
  uint32_t base_00;
  Variant *pVVar2;
  bool bVar3;
  uint32_t *args;
  SPIRType *type;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  ulong uVar6;
  SPIRAccessChain *e;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  bool row_major_matrix;
  undefined4 local_94;
  uint32_t array_stride;
  uint32_t matrix_stride;
  SPIRAccessChain *local_88;
  string base;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  offsets;
  
  args = Compiler::stream((Compiler *)this,instruction);
  uVar1 = instruction->length;
  type = Compiler::expression_type((Compiler *)this,args[2]);
  uVar9 = (ulong)args[2];
  if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar9].type == TypeAccessChain)) {
    local_88 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar9);
    local_94 = 0;
    uVar9 = 0;
  }
  else {
    if ((type->storage != StorageClassStorageBuffer) &&
       (bVar3 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock
                          ), !bVar3)) {
LAB_0021f1c1:
      CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
      return;
    }
    uVar9 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    if (uVar1 - 3 <= uVar9) goto LAB_0021f1c1;
    local_94 = (undefined4)CONCAT71((uint7)(uint3)(uVar1 - 3 >> 8),1);
    local_88 = (SPIRAccessChain *)0x0;
  }
  pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,args[2]);
  base._M_dataplus._M_p = (pointer)&base.field_2;
  base._M_string_length = 0;
  base.field_2._M_local_buf[0] = '\0';
  uVar7 = (uint32_t)uVar9;
  if (uVar7 == 0) {
    if ((char)local_94 == '\0') {
      ::std::__cxx11::string::_M_assign((string *)&base);
      goto LAB_0021f230;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&offsets.first,&this->super_CompilerGLSL,args[2],true);
    ::std::__cxx11::string::operator=((string *)&base,(string *)&offsets);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)offsets.first._M_dataplus._M_p == &offsets.first.field_2) goto LAB_0021f230;
  }
  else {
    base_00 = args[2];
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    CompilerGLSL::access_chain_abi_cxx11_
              (&offsets.first,&this->super_CompilerGLSL,base_00,args + 3,uVar7,pSVar5,
               (AccessChainMeta *)0x0,false);
    ::std::__cxx11::string::operator=((string *)&base,(string *)&offsets);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)offsets.first._M_dataplus._M_p == &offsets.first.field_2) goto LAB_0021f230;
  }
  operator_delete(offsets.first._M_dataplus._M_p);
LAB_0021f230:
  pSVar5 = Compiler::get_pointee_type((Compiler *)this,type);
  if (uVar7 != 0) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      uVar6 = (ulong)(pSVar5->parent_type).id;
      if (uVar6 == 0) {
        __assert_fail("basetype->parent_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_hlsl.cpp"
                      ,0x10a9,
                      "void spirv_cross::CompilerHLSL::emit_access_chain(const Instruction &)");
      }
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar6);
      uVar8 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  matrix_stride = 0;
  array_stride = 0;
  row_major_matrix = false;
  if ((char)local_94 == '\0') {
    matrix_stride = local_88->matrix_stride;
    row_major_matrix = local_88->row_major_matrix;
    array_stride = local_88->array_stride;
  }
  CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
            (&offsets,&this->super_CompilerGLSL,pSVar5,args + (uVar7 + 3),(uVar1 - uVar7) - 3,0,1,
             &row_major_matrix,&matrix_stride,&array_stride,false);
  e = Compiler::
      set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
                ((Compiler *)this,args[1],args,&type->storage,&base,&offsets.first,&offsets.second);
  e->row_major_matrix = row_major_matrix;
  e->matrix_stride = matrix_stride;
  e->array_stride = array_stride;
  bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[2]);
  e->immutable = bVar3;
  if (pSVar4 == (SPIRVariable *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (pSVar4->super_IVariant).self.id;
  }
  (e->loaded_from).id = uVar7;
  if ((char)local_94 == '\0') {
    ::std::__cxx11::string::_M_append
              ((char *)&e->dynamic_index,(ulong)(local_88->dynamic_index)._M_dataplus._M_p);
    e->static_index = e->static_index + local_88->static_index;
  }
  if (2 < uVar1) {
    uVar9 = 2;
    do {
      Compiler::inherit_expression_dependencies((Compiler *)this,args[1],args[uVar9]);
      Compiler::add_implied_read_expression((Compiler *)this,e,args[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  bVar3 = Compiler::has_decoration((Compiler *)this,(ID)args[1],DecorationNonUniform);
  if (bVar3) {
    CompilerGLSL::propagate_nonuniform_qualifier(&this->super_CompilerGLSL,args[1]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsets.first._M_dataplus._M_p != &offsets.first.field_2) {
    operator_delete(offsets.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base._M_dataplus._M_p != &base.field_2) {
    operator_delete(base._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_access_chain(const Instruction &instruction)
{
	auto ops = stream(instruction);
	uint32_t length = instruction.length;

	bool need_byte_access_chain = false;
	auto &type = expression_type(ops[2]);
	const auto *chain = maybe_get<SPIRAccessChain>(ops[2]);

	if (chain)
	{
		// Keep tacking on an existing access chain.
		need_byte_access_chain = true;
	}
	else if (type.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock))
	{
		// If we are starting to poke into an SSBO, we are dealing with ByteAddressBuffers, and we need
		// to emit SPIRAccessChain rather than a plain SPIRExpression.
		uint32_t chain_arguments = length - 3;
		if (chain_arguments > type.array.size())
			need_byte_access_chain = true;
	}

	if (need_byte_access_chain)
	{
		// If we have a chain variable, we are already inside the SSBO, and any array type will refer to arrays within a block,
		// and not array of SSBO.
		uint32_t to_plain_buffer_length = chain ? 0u : static_cast<uint32_t>(type.array.size());

		auto *backing_variable = maybe_get_backing_variable(ops[2]);

		string base;
		if (to_plain_buffer_length != 0)
			base = access_chain(ops[2], &ops[3], to_plain_buffer_length, get<SPIRType>(ops[0]));
		else if (chain)
			base = chain->base;
		else
			base = to_expression(ops[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *basetype = &get_pointee_type(type);

		// Traverse the type hierarchy down to the actual buffer types.
		for (uint32_t i = 0; i < to_plain_buffer_length; i++)
		{
			assert(basetype->parent_type);
			basetype = &get<SPIRType>(basetype->parent_type);
		}

		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool row_major_matrix = false;

		// Inherit matrix information.
		if (chain)
		{
			matrix_stride = chain->matrix_stride;
			row_major_matrix = chain->row_major_matrix;
			array_stride = chain->array_stride;
		}

		auto offsets = flattened_access_chain_offset(*basetype, &ops[3 + to_plain_buffer_length],
		                                             length - 3 - to_plain_buffer_length, 0, 1, &row_major_matrix,
		                                             &matrix_stride, &array_stride);

		auto &e = set<SPIRAccessChain>(ops[1], ops[0], type.storage, base, offsets.first, offsets.second);
		e.row_major_matrix = row_major_matrix;
		e.matrix_stride = matrix_stride;
		e.array_stride = array_stride;
		e.immutable = should_forward(ops[2]);
		e.loaded_from = backing_variable ? backing_variable->self : ID(0);

		if (chain)
		{
			e.dynamic_index += chain->dynamic_index;
			e.static_index += chain->static_index;
		}

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(e, ops[i]);
		}

		if (has_decoration(ops[1], DecorationNonUniformEXT))
			propagate_nonuniform_qualifier(ops[1]);
	}
	else
	{
		CompilerGLSL::emit_instruction(instruction);
	}
}